

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O2

ssize_t __thiscall
sc_core::wif_unsigned_int_trace::write(wif_unsigned_int_trace *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  uint uVar5;
  char buf [1000];
  
  uVar1 = *this->object;
  uVar2 = (this->super_wif_trace).bit_width;
  if ((uVar1 & ~this->mask) == 0) {
    uVar5 = 1 << ((char)uVar2 - 1U & 0x1f);
    uVar3 = 0;
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      buf[uVar3] = (uVar1 & uVar5) == 0 ^ 0x31;
      uVar5 = uVar5 >> 1;
    }
  }
  else {
    uVar3 = 0;
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar4 = 0;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      buf[uVar3] = '0';
    }
  }
  buf[uVar4] = '\0';
  fprintf((FILE *)CONCAT44(in_register_00000034,__fd),"assign %s \"%s\" ;\n",
          (this->super_wif_trace).wif_name._M_dataplus._M_p,buf);
  uVar1 = *this->object;
  this->old_value = uVar1;
  return (ulong)uVar1;
}

Assistant:

void wif_unsigned_int_trace::write(FILE* f)
{
    char buf[1000];
    int bitindex;

    // Check for overflow
    if ((object & mask) != object) {
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            buf[bitindex] = '0';
        }
    }
    else{
        unsigned bit_mask = 1 << (bit_width-1);
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            buf[bitindex] = (object & bit_mask)? '1' : '0';
            bit_mask = bit_mask >> 1;
        }
    }
    buf[bitindex] = '\0';
    std::fprintf(f, "assign %s \"%s\" ;\n", wif_name.c_str(), buf);
    old_value = object;
}